

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCUtil.cpp
# Opt level: O2

void __thiscall Assimp::IFC::TempMesh::FixupFaceOrientation(TempMesh *this)

{
  pointer puVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  pointer paVar4;
  bool bVar5;
  mapped_type *pmVar6;
  pointer puVar7;
  mapped_type *pmVar8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var9;
  difference_type dVar10;
  pointer paVar11;
  aiVector3t<double> *paVar12;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  _Var13;
  ulong uVar14;
  pointer puVar15;
  double dVar16;
  long lVar17;
  unsigned_long uVar18;
  unsigned_long uVar19;
  double dVar20;
  size_t b;
  ulong uVar21;
  TempMesh *pTVar22;
  ulong uVar23;
  double dVar24;
  double dVar27;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar28;
  double dVar29;
  double dVar30;
  reference rVar31;
  _Bit_iterator __first;
  _Bit_iterator __last;
  double local_178;
  size_t farthestIndex;
  TempMesh *local_168;
  double local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> todo;
  size_t nbi;
  vector<unsigned_long,_std::allocator<unsigned_long>_> faceStartIndices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> neighbour;
  vector<bool,_std::allocator<bool>_> faceDone;
  IfcVector3 farthestNormal;
  FuzzyVectorCompare local_a8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> tempIntersect;
  IfcVector3 vavg;
  map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  facesByVertex;
  
  Center(&vavg,this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&faceStartIndices,
             (long)(this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2,(allocator_type *)&facesByVertex);
  puVar7 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar19 = 0;
  for (uVar14 = 0;
      puVar15 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish,
      uVar14 < (ulong)((long)puVar15 - (long)puVar7 >> 2); uVar14 = uVar14 + 1) {
    faceStartIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar14] = uVar19;
    puVar7 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar19 = uVar19 + puVar7[uVar14];
  }
  facesByVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &facesByVertex._M_t._M_impl.super__Rb_tree_header._M_header;
  facesByVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  facesByVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  facesByVertex._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  facesByVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       facesByVertex._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (faceDone.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
       .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      faceDone.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p < (_Bit_type *)((long)puVar15 - (long)puVar7 >> 2);
      faceDone.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p =
           (_Bit_type *)
           ((long)faceDone.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1)) {
    lVar17 = 0;
    for (uVar14 = 0;
        uVar14 < puVar7[(long)faceDone.super__Bvector_base<std::allocator<bool>_>._M_impl.
                              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p];
        uVar14 = uVar14 + 1) {
      pmVar6 = std::
               map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::operator[](&facesByVertex,
                            (key_type *)
                            ((long)&(this->mVerts).
                                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start
                                    [faceStartIndices.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_start
                                     [(long)faceDone.super__Bvector_base<std::allocator<bool>_>.
                                            _M_impl.super__Bvector_impl_data._M_start.
                                            super__Bit_iterator_base._M_p]].x + lVar17));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (pmVar6,(value_type_conflict3 *)&faceDone);
      puVar7 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar17 = lVar17 + 0x18;
    }
    puVar15 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  }
  faceDone.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0xffffffffffffffff;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&neighbour,
             ((long)(this->mVerts).
                    super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->mVerts).
                   super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18,
             (value_type_conflict3 *)&faceDone,(allocator_type *)&tempIntersect);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&tempIntersect,10,(allocator_type *)&faceDone);
  puVar7 = (this->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar16 = 0.0;
  local_168 = this;
  while (pTVar22 = local_168,
        dVar20 = (double)((long)(local_168->mVertcnt).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 2),
        (ulong)dVar16 < (ulong)dVar20) {
    local_160 = dVar16;
    for (uVar14 = 0; pTVar22 = local_168, uVar3 = puVar7[(long)local_160], uVar14 < uVar3;
        uVar14 = uVar14 + 1) {
      uVar19 = faceStartIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[(long)local_160];
      lVar17 = uVar19 + uVar14;
      pmVar6 = std::
               map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::operator[](&facesByVertex,
                            (local_168->mVerts).
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar17);
      pmVar8 = std::
               map<aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ::operator[](&facesByVertex,
                            (pTVar22->mVerts).
                            super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start +
                            uVar19 + (ulong)((int)uVar14 + 1) % (ulong)uVar3);
      puVar1 = tempIntersect.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      _Var9 = std::
              __set_intersection<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                        ((pmVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pmVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data._M_finish,
                         (pmVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data._M_start,
                         (pmVar8->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data._M_finish,
                         tempIntersect.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start);
      if ((long)_Var9._M_current - (long)puVar1 == 0x10) {
        neighbour.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[lVar17] = puVar1[(double)*puVar1 == local_160];
      }
      puVar7 = (local_168->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    dVar16 = (double)((long)local_160 + 1);
  }
  farthestNormal.x._0_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&faceDone,(size_type)dVar20,(bool *)&farthestNormal,(allocator_type *)&todo);
  do {
    farthestNormal.x._0_1_ = 0;
    __first.super__Bit_iterator_base._8_8_ = 0;
    __first.super__Bit_iterator_base._M_p =
         faceDone.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._M_p;
    __last.super__Bit_iterator_base._12_4_ = 0;
    __last.super__Bit_iterator_base._M_p =
         faceDone.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_p;
    __last.super__Bit_iterator_base._M_offset =
         faceDone.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._M_offset;
    dVar10 = std::__count_if<std::_Bit_iterator,__gnu_cxx::__ops::_Iter_equals_val<bool_const>>
                       (__first,__last,(_Iter_equals_val<const_bool>)&farthestNormal);
    dVar20 = vavg.y;
    dVar16 = vavg.x;
    if (dVar10 == 0) {
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&faceDone.super__Bvector_base<std::allocator<bool>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&tempIntersect.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&neighbour.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      std::
      _Rb_tree<aiVector3t<double>,_std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::_Select1st<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_Assimp::IFC::CompareVector,_std::allocator<std::pair<const_aiVector3t<double>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
      ::~_Rb_tree(&facesByVertex._M_t);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&faceStartIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                );
      return;
    }
    farthestIndex = 0xffffffffffffffff;
    local_160 = vavg.z;
    local_178 = -1.0;
    for (uVar14 = 0;
        puVar7 = (pTVar22->mVertcnt).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar14 < (ulong)((long)(pTVar22->mVertcnt).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar7 >> 2);
        uVar14 = uVar14 + 1) {
      rVar31 = std::vector<bool,_std::allocator<bool>_>::operator[](&faceDone,uVar14);
      if ((*rVar31._M_p & rVar31._M_mask) == 0) {
        paVar11 = (pTVar22->mVerts).
                  super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                  _M_impl.super__Vector_impl_data._M_start +
                  faceStartIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar14];
        uVar23 = (ulong)(pTVar22->mVertcnt).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar14];
        dVar24 = 0.0;
        dVar27 = 0.0;
        dVar28 = 0.0;
        for (lVar17 = uVar23 * 0x18; lVar17 != 0; lVar17 = lVar17 + -0x18) {
          dVar28 = dVar28 + paVar11->x;
          dVar24 = dVar24 + paVar11->y;
          dVar27 = dVar27 + paVar11->z;
          paVar11 = paVar11 + 1;
        }
        dVar30 = 1.0 / (double)uVar23;
        dVar28 = dVar28 * dVar30 - dVar16;
        dVar29 = dVar30 * dVar24 - dVar20;
        dVar24 = dVar27 * dVar30 - local_160;
        dVar24 = dVar24 * dVar24 + dVar28 * dVar28 + dVar29 * dVar29;
        if (local_178 < dVar24) {
          local_178 = dVar24;
          farthestIndex = uVar14;
        }
      }
    }
    ComputePolygonNormal
              (&farthestNormal,
               (pTVar22->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_start +
               faceStartIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[farthestIndex],(ulong)puVar7[farthestIndex],
               true);
    paVar11 = (pTVar22->mVerts).
              super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
              super__Vector_impl_data._M_start +
              faceStartIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start[farthestIndex];
    uVar14 = (ulong)(pTVar22->mVertcnt).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start[farthestIndex];
    dVar27 = 0.0;
    dVar28 = 0.0;
    dVar24 = 0.0;
    for (lVar17 = uVar14 * 0x18; lVar17 != 0; lVar17 = lVar17 + -0x18) {
      dVar27 = dVar27 + paVar11->x;
      dVar28 = dVar28 + paVar11->y;
      dVar24 = dVar24 + paVar11->z;
      paVar11 = paVar11 + 1;
    }
    dVar29 = 1.0 / (double)uVar14;
    todo.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)(dVar24 * dVar29 - local_160);
    todo.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(dVar29 * dVar27 - dVar16);
    todo.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(dVar29 * dVar28 - dVar20);
    paVar12 = aiVector3t<double>::Normalize((aiVector3t<double> *)&todo);
    if (farthestNormal.z * paVar12->z +
        (double)CONCAT71(farthestNormal.x._1_7_,farthestNormal.x._0_1_) * paVar12->x +
        farthestNormal.y * paVar12->y < -0.4) {
      uVar19 = faceStartIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[farthestIndex];
      uVar14 = (ulong)(pTVar22->mVertcnt).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[farthestIndex];
      paVar11 = (pTVar22->mVerts).
                super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl
                .super__Vector_impl_data._M_start + uVar19;
      std::
      __reverse<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                (paVar11,paVar11 + uVar14);
      std::
      __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                (neighbour.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start + uVar19,
                 neighbour.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start + uVar19 + uVar14);
      while (uVar14 = uVar14 - 1, uVar14 != 0) {
        auVar2 = *(undefined1 (*) [16])
                  (neighbour.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar19);
        auVar25._0_8_ = auVar2._8_8_;
        auVar25._8_4_ = auVar2._0_4_;
        auVar25._12_4_ = auVar2._4_4_;
        *(undefined1 (*) [16])
         (neighbour.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start + uVar19) = auVar25;
        uVar19 = uVar19 + 1;
      }
    }
    rVar31 = std::vector<bool,_std::allocator<bool>_>::operator[](&faceDone,farthestIndex);
    *rVar31._M_p = *rVar31._M_p | rVar31._M_mask;
    todo.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    todo.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    todo.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&todo,&farthestIndex);
    while (todo.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start !=
           todo.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish) {
      puVar1 = todo.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
      todo.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish =
           todo.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
      uVar19 = faceStartIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[*puVar1];
      uVar14 = (ulong)(pTVar22->mVertcnt).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[*puVar1];
      for (uVar23 = 0; uVar23 != uVar14; uVar23 = uVar23 + 1) {
        nbi = neighbour.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[uVar23 + uVar19];
        if (nbi != 0xffffffffffffffff) {
          rVar31 = std::vector<bool,_std::allocator<bool>_>::operator[](&faceDone,nbi);
          if ((*rVar31._M_p & rVar31._M_mask) == 0) {
            uVar18 = faceStartIndices.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[nbi];
            uVar21 = (ulong)(pTVar22->mVertcnt).
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start[nbi];
            paVar11 = (pTVar22->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start + uVar18;
            _Var13 = std::
                     __find_if<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,__gnu_cxx::__ops::_Iter_pred<Assimp::IFC::FindVector>>
                               (paVar11,paVar11 + uVar21);
            paVar4 = (pTVar22->mVerts).
                     super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            paVar11 = paVar4 + uVar18;
            if (_Var13._M_current == paVar11 + uVar21) {
              __assert_fail("it != mVerts.begin() + nbvsi + nbvc",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Importer/IFC/IFCUtil.cpp"
                            ,0x162,"void Assimp::IFC::TempMesh::FixupFaceOrientation()");
            }
            local_a8.epsilon = 1e-06;
            bVar5 = FuzzyVectorCompare::operator()
                              (&local_a8,paVar4 + uVar19 + (uVar23 + 1) % uVar14,
                               paVar11 + (((long)_Var13._M_current - (long)paVar11) / 0x18 + 1U) %
                                         uVar21);
            if (bVar5) {
              paVar11 = (local_168->mVerts).
                        super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + uVar18;
              std::
              __reverse<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>
                        (paVar11,paVar11 + uVar21);
              std::
              __reverse<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        (neighbour.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar18,
                         neighbour.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar18 + uVar21);
              while (uVar21 = uVar21 - 1, uVar21 != 0) {
                auVar2 = *(undefined1 (*) [16])
                          (neighbour.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + uVar18);
                auVar26._0_8_ = auVar2._8_8_;
                auVar26._8_4_ = auVar2._0_4_;
                auVar26._12_4_ = auVar2._4_4_;
                *(undefined1 (*) [16])
                 (neighbour.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar18) = auVar26;
                uVar18 = uVar18 + 1;
              }
            }
            rVar31 = std::vector<bool,_std::allocator<bool>_>::operator[](&faceDone,nbi);
            *rVar31._M_p = *rVar31._M_p | rVar31._M_mask;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(&todo,&nbi);
            pTVar22 = local_168;
          }
        }
      }
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&todo.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  } while( true );
}

Assistant:

void TempMesh::FixupFaceOrientation()
{
    const IfcVector3 vavg = Center();

    // create a list of start indices for all faces to allow random access to faces
    std::vector<size_t> faceStartIndices(mVertcnt.size());
    for( size_t i = 0, a = 0; a < mVertcnt.size(); i += mVertcnt[a], ++a )
        faceStartIndices[a] = i;

    // list all faces on a vertex
    std::map<IfcVector3, std::vector<size_t>, CompareVector> facesByVertex;
    for( size_t a = 0; a < mVertcnt.size(); ++a )
    {
        for( size_t b = 0; b < mVertcnt[a]; ++b )
            facesByVertex[mVerts[faceStartIndices[a] + b]].push_back(a);
    }
    // determine neighbourhood for all polys
    std::vector<size_t> neighbour(mVerts.size(), SIZE_MAX);
    std::vector<size_t> tempIntersect(10);
    for( size_t a = 0; a < mVertcnt.size(); ++a )
    {
        for( size_t b = 0; b < mVertcnt[a]; ++b )
        {
            size_t ib = faceStartIndices[a] + b, nib = faceStartIndices[a] + (b + 1) % mVertcnt[a];
            const std::vector<size_t>& facesOnB = facesByVertex[mVerts[ib]];
            const std::vector<size_t>& facesOnNB = facesByVertex[mVerts[nib]];
            // there should be exactly one or two faces which appear in both lists. Our face and the other side
            std::vector<size_t>::iterator sectstart = tempIntersect.begin();
            std::vector<size_t>::iterator sectend = std::set_intersection(
                facesOnB.begin(), facesOnB.end(), facesOnNB.begin(), facesOnNB.end(), sectstart);

            if( std::distance(sectstart, sectend) != 2 )
                continue;
            if( *sectstart == a )
                ++sectstart;
            neighbour[ib] = *sectstart;
        }
    }

    // now we're getting started. We take the face which is the farthest away from the center. This face is most probably
    // facing outwards. So we reverse this face to point outwards in relation to the center. Then we adapt neighbouring
    // faces to have the same winding until all faces have been tested.
    std::vector<bool> faceDone(mVertcnt.size(), false);
    while( std::count(faceDone.begin(), faceDone.end(), false) != 0 )
    {
        // find the farthest of the remaining faces
        size_t farthestIndex = SIZE_MAX;
        IfcFloat farthestDistance = -1.0;
        for( size_t a = 0; a < mVertcnt.size(); ++a )
        {
            if( faceDone[a] )
                continue;
            IfcVector3 faceCenter = std::accumulate(mVerts.begin() + faceStartIndices[a],
                mVerts.begin() + faceStartIndices[a] + mVertcnt[a], IfcVector3(0.0)) / IfcFloat(mVertcnt[a]);
            IfcFloat dst = (faceCenter - vavg).SquareLength();
            if( dst > farthestDistance ) { farthestDistance = dst; farthestIndex = a; }
        }

        // calculate its normal and reverse the poly if its facing towards the mesh center
        IfcVector3 farthestNormal = ComputePolygonNormal(mVerts.data() + faceStartIndices[farthestIndex], mVertcnt[farthestIndex]);
        IfcVector3 farthestCenter = std::accumulate(mVerts.begin() + faceStartIndices[farthestIndex],
            mVerts.begin() + faceStartIndices[farthestIndex] + mVertcnt[farthestIndex], IfcVector3(0.0))
            / IfcFloat(mVertcnt[farthestIndex]);
        // We accept a bit of negative orientation without reversing. In case of doubt, prefer the orientation given in
        // the file.
        if( (farthestNormal * (farthestCenter - vavg).Normalize()) < -0.4 )
        {
            size_t fsi = faceStartIndices[farthestIndex], fvc = mVertcnt[farthestIndex];
            std::reverse(mVerts.begin() + fsi, mVerts.begin() + fsi + fvc);
            std::reverse(neighbour.begin() + fsi, neighbour.begin() + fsi + fvc);
            // because of the neighbour index belonging to the edge starting with the point at the same index, we need to
            // cycle the neighbours through to match the edges again.
            // Before: points A - B - C - D with edge neighbour p - q - r - s
            // After: points D - C - B - A, reversed neighbours are s - r - q - p, but the should be
            //                r   q   p   s
            for( size_t a = 0; a < fvc - 1; ++a )
                std::swap(neighbour[fsi + a], neighbour[fsi + a + 1]);
        }
        faceDone[farthestIndex] = true;
        std::vector<size_t> todo;
        todo.push_back(farthestIndex);

        // go over its neighbour faces recursively and adapt their winding order to match the farthest face
        while( !todo.empty() )
        {
            size_t tdf = todo.back();
            size_t vsi = faceStartIndices[tdf], vc = mVertcnt[tdf];
            todo.pop_back();

            // check its neighbours
            for( size_t a = 0; a < vc; ++a )
            {
                // ignore neighbours if we already checked them
                size_t nbi = neighbour[vsi + a];
                if( nbi == SIZE_MAX || faceDone[nbi] )
                    continue;

                const IfcVector3& vp = mVerts[vsi + a];
                size_t nbvsi = faceStartIndices[nbi], nbvc = mVertcnt[nbi];
                std::vector<IfcVector3>::iterator it = std::find_if(mVerts.begin() + nbvsi, mVerts.begin() + nbvsi + nbvc, FindVector(vp));
                ai_assert(it != mVerts.begin() + nbvsi + nbvc);
                size_t nb_vidx = std::distance(mVerts.begin() + nbvsi, it);
                // two faces winded in the same direction should have a crossed edge, where one face has p0->p1 and the other
                // has p1'->p0'. If the next point on the neighbouring face is also the next on the current face, we need
                // to reverse the neighbour
                nb_vidx = (nb_vidx + 1) % nbvc;
                size_t oursideidx = (a + 1) % vc;
                if( FuzzyVectorCompare(1e-6)(mVerts[vsi + oursideidx], mVerts[nbvsi + nb_vidx]) )
                {
                    std::reverse(mVerts.begin() + nbvsi, mVerts.begin() + nbvsi + nbvc);
                    std::reverse(neighbour.begin() + nbvsi, neighbour.begin() + nbvsi + nbvc);
                    for( size_t a = 0; a < nbvc - 1; ++a )
                        std::swap(neighbour[nbvsi + a], neighbour[nbvsi + a + 1]);
                }

                // either way we're done with the neighbour. Mark it as done and continue checking from there recursively
                faceDone[nbi] = true;
                todo.push_back(nbi);
            }
        }

        // no more faces reachable from this part of the surface, start over with a disjunct part and its farthest face
    }
}